

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O1

void __thiscall InputBuffer::syncConsume(InputBuffer *this)

{
  pointer __src;
  pointer *ppiVar1;
  int iVar2;
  pointer __dest;
  pointer piVar3;
  
  if (0 < this->numToConsume) {
    do {
      if (this->nMarkers < 1) {
        __dest = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar3 != __dest) {
          __src = __dest + 1;
          if (__src != piVar3) {
            memmove(__dest,__src,(long)piVar3 - (long)__src);
          }
          ppiVar1 = &(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppiVar1 = *ppiVar1 + -1;
        }
      }
      else {
        this->markerOffset = this->markerOffset + 1;
      }
      iVar2 = this->numToConsume;
      this->numToConsume = iVar2 + -1;
    } while (1 < iVar2);
  }
  return;
}

Assistant:

void InputBuffer::syncConsume() {
	while (numToConsume > 0) {
		if (nMarkers > 0)
		{
			// guess mode -- leave leading characters and bump offset.
			markerOffset++;
		} else {
			// normal mode -- remove first character
			queue.removeFirst();
		}
		numToConsume--;
	}
}